

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O1

PyObject * __thiscall
boost::python::detail::caller_arity<2U>::
impl<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::python::default_call_policies,_boost::mpl::vector3<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator()(impl<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::python::default_call_policies,_boost::mpl::vector3<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  long lVar2;
  long *plVar3;
  PyObject *pPVar4;
  code *pcVar5;
  c_t1 c1;
  long *local_88 [2];
  long local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [2];
  _object *local_38;
  
  lVar2 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<AbstractModuleClient_const_volatile&>::
                     converters);
  if (lVar2 == 0) {
    pPVar4 = (PyObject *)0x0;
  }
  else {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    local_68 = converter::rvalue_from_python_stage1
                         (p_Var1,converter::detail::
                                 registered_base<std::__cxx11::string_const_volatile&>::converters);
    local_38 = p_Var1;
    if (local_68._0_8_ == 0) {
      pPVar4 = (PyObject *)0x0;
    }
    else {
      pcVar5 = (code *)(this->m_data).
                       super_compressed_pair_imp<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::python::default_call_policies,_2>
                       .first_;
      plVar3 = (long *)(lVar2 + *(long *)&(this->m_data).
                                          super_compressed_pair_imp<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::python::default_call_policies,_2>
                                          .field_0x8);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar3 + -1);
      }
      if (local_68._8_8_ != (code *)0x0) {
        (*local_68._8_8_)(p_Var1,local_68);
      }
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,*(long *)local_68._0_8_,
                 *(long *)(local_68._0_8_ + 8) + *(long *)local_68._0_8_);
      (*pcVar5)(plVar3,local_88);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
      pPVar4 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    if (((long **)local_68._0_8_ == local_58) && (local_58[0] != local_48)) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  return pPVar4;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }